

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# measunit.cpp
# Opt level: O0

int32_t icu_63::MeasureUnit::getAvailable
                  (char *type,MeasureUnit *dest,int32_t destCapacity,UErrorCode *errorCode)

{
  UBool UVar1;
  int32_t typeId;
  int local_3c;
  int subTypeIdx;
  int32_t len;
  int32_t typeIdx;
  UErrorCode *errorCode_local;
  int32_t destCapacity_local;
  MeasureUnit *dest_local;
  char *type_local;
  
  UVar1 = ::U_FAILURE(*errorCode);
  if (UVar1 == '\0') {
    typeId = binarySearch((char **)gTypes,0,0x14,type);
    if (typeId == -1) {
      type_local._4_4_ = 0;
    }
    else {
      type_local._4_4_ =
           *(int *)(gOffsets + (long)(typeId + 1) * 4) - *(int *)(gOffsets + (long)typeId * 4);
      if (destCapacity < type_local._4_4_) {
        *errorCode = U_BUFFER_OVERFLOW_ERROR;
      }
      else {
        for (local_3c = 0; local_3c < type_local._4_4_; local_3c = local_3c + 1) {
          setTo(dest + local_3c,typeId,local_3c);
        }
      }
    }
  }
  else {
    type_local._4_4_ = 0;
  }
  return type_local._4_4_;
}

Assistant:

int32_t MeasureUnit::getAvailable(
        const char *type,
        MeasureUnit *dest,
        int32_t destCapacity,
        UErrorCode &errorCode) {
    if (U_FAILURE(errorCode)) {
        return 0;
    }
    int32_t typeIdx = binarySearch(gTypes, 0, UPRV_LENGTHOF(gTypes), type);
    if (typeIdx == -1) {
        return 0;
    }
    int32_t len = gOffsets[typeIdx + 1] - gOffsets[typeIdx];
    if (destCapacity < len) {
        errorCode = U_BUFFER_OVERFLOW_ERROR;
        return len;
    }
    for (int subTypeIdx = 0; subTypeIdx < len; ++subTypeIdx) {
        dest[subTypeIdx].setTo(typeIdx, subTypeIdx);
    }
    return len;
}